

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_paste_replace(_glist *x)

{
  t_selection *ptVar1;
  long *plVar2;
  _glist *x_00;
  int iVar3;
  undefined4 extraout_var;
  t_object *ptVar4;
  t_symbol *ptVar5;
  long *plVar6;
  void *pvVar7;
  t_gobj *y;
  int dy;
  t_selection **pptVar8;
  int dx;
  t_symbol *ptVar9;
  bool bVar10;
  bool bVar11;
  int y0;
  int x0;
  long *local_48;
  t_symbol *typ0;
  _glist *local_38;
  
  x0 = 0;
  y0 = 0;
  typ0 = (t_symbol *)0x0;
  if ((x->gl_editor != (t_editor *)0x0) && (x->gl_editor->e_selection != (t_selection *)0x0)) {
    iVar3 = binbuf_getpos(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor,&x0,&y0,&typ0);
    if (iVar3 == 1) {
      local_38 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar3));
      ptVar9 = (t_symbol *)0x0;
      pptVar8 = &x->gl_editor->e_selection;
      while (ptVar1 = *pptVar8, ptVar1 != (t_selection *)0x0) {
        ptVar4 = pd_checkobject(&ptVar1->sel_what->g_pd);
        ptVar5 = get_object_type(ptVar4);
        if ((ptVar5 != (t_symbol *)0x0) &&
           (bVar10 = ptVar9 != (t_symbol *)0x0, bVar11 = ptVar9 != ptVar5, ptVar9 = ptVar5,
           bVar10 && bVar11)) {
          ptVar9 = (t_symbol *)0x0;
          break;
        }
        pptVar8 = &ptVar1->sel_next;
      }
      local_48 = (long *)0x0;
      pptVar8 = &x->gl_editor->e_selection;
      while (ptVar1 = *pptVar8, ptVar1 != (t_selection *)0x0) {
        ptVar4 = pd_checkobject(&ptVar1->sel_what->g_pd);
        if (ptVar4 != (t_object *)0x0) {
          if (ptVar9 == (t_symbol *)0x0) {
            ptVar5 = get_object_type(ptVar4);
            if (ptVar5 != typ0) goto LAB_0013f003;
          }
          plVar6 = (long *)getbytes(0x10);
          *plVar6 = (long)ptVar1->sel_what;
          plVar6[1] = (long)local_48;
          local_48 = plVar6;
        }
LAB_0013f003:
        pptVar8 = &ptVar1->sel_next;
      }
      canvas_undo_add(x,UNDO_SEQUENCE_START,"paste/replace",(void *)0x0);
      x_00 = local_38;
      for (plVar6 = local_48; plVar6 != (long *)0x0; plVar6 = (long *)plVar6[1]) {
        dx = *(short *)(*plVar6 + 0x28) - x0;
        dy = *(short *)(*plVar6 + 0x2a) - y0;
        glist_noselect(x);
        *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 0;
        pvVar7 = canvas_undo_set_arrange(x,(t_gobj *)*plVar6,1);
        canvas_undo_add(x,UNDO_ARRANGE,"arrange",pvVar7);
        canvas_stowconnections(x_00);
        pvVar7 = canvas_undo_set_cut(x,2);
        canvas_undo_add(x,UNDO_CUT,"clear",pvVar7);
        canvas_doclear(x);
        canvas_applybinbuf(x,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
        glist_noselect(x);
        iVar3 = glist_getindex(x,(t_gobj *)0x0);
        y = glist_nth(x,iVar3 + -1);
        glist_select(x,y);
        canvas_displaceselection(x,dx,dy);
        canvas_restoreconnections(x_00);
        pvVar7 = canvas_undo_set_create(x);
        canvas_undo_add(x,UNDO_CREATE,"create",pvVar7);
        if ((pd_maininstance.pd_newest != (t_pd *)0x0) &&
           (*pd_maininstance.pd_newest == canvas_class)) {
          canvas_loadbang((_glist *)pd_maininstance.pd_newest);
        }
      }
      canvas_undo_add(x,UNDO_SEQUENCE_END,"paste/replace",(void *)0x0);
      plVar6 = local_48;
      while (plVar6 != (long *)0x0) {
        plVar2 = (long *)plVar6[1];
        freebytes(plVar6,0x10);
        plVar6 = plVar2;
      }
    }
  }
  return;
}

Assistant:

static void canvas_paste_replace(t_canvas *x)
{
    int x0=0, y0=0;
    t_symbol *typ0 = 0;
    if (!x->gl_editor)
        return;
    if(x->gl_editor->e_selection && 1==binbuf_getpos(EDITOR->copy_binbuf, &x0, &y0, &typ0))
    {
        t_canvas *canvas = glist_getcanvas(x);
        t_selection *mysel = 0, *y;
        t_symbol *seltype = 0;

            /* check whether all the selected objects have the same type */
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
        {
            t_symbol *s=get_object_type(pd_checkobject(&y->sel_what->g_pd));
            if (!s)
                continue;
            if(seltype && seltype != s)
            {
                seltype = 0;
                break;
            }
            seltype = s;
        }

            /* we will do a lot of reslecting; so copy the selection */
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
        {
            t_selection *sel = 0;
            t_object *obj=pd_checkobject(&y->sel_what->g_pd);
            if(!obj)
               continue;
                    /* if the selection mixes obj, msg,... we only want to
                     * replace the same type;
                     * if the selection is homogeneous (seltype==NULL), we also allow typechanges
                     */
            if (!seltype && get_object_type(obj) != typ0)
                continue;
            sel = (t_selection *)getbytes(sizeof(*sel));
            sel->sel_what = y->sel_what;
            sel->sel_next = mysel;
            mysel = sel;
        }

        canvas_undo_add(x, UNDO_SEQUENCE_START, "paste/replace", 0);

        for (y = mysel; y; y = y->sel_next)
        {
            t_object *o = (t_object *)(&y->sel_what->g_pd);
            int dx = o->te_xpix - x0;
            int dy = o->te_ypix - y0;
            glist_noselect(x);
            EDITOR->canvas_undo_already_set_move = 0;
                /* save connections and move object to the end */
                /* note: the undo sequence selects the object as a side-effect */
            canvas_undo_add(x, UNDO_ARRANGE, "arrange",
                canvas_undo_set_arrange(x, y->sel_what, 1));
            canvas_stowconnections(canvas);
                /* recreate object */
                /* remove the old object */
            canvas_undo_add(x, UNDO_CUT, "clear",
                canvas_undo_set_cut(x, UCUT_CLEAR));
            canvas_doclear(x);

                /* create the new object (and loadbang if needed) */
            canvas_applybinbuf(x, EDITOR->copy_binbuf);

            glist_noselect(x);
            glist_select(x, glist_nth(x, glist_getindex(x, 0) - 1));
                /* displace object (includes UNDO) */
            canvas_displaceselection(x, dx, dy);
                /* restore connections */
            canvas_restoreconnections(canvas);

            canvas_undo_add(x, UNDO_CREATE, "create",
                (void *)canvas_undo_set_create(x));

            if (pd_this->pd_newest && pd_class(pd_this->pd_newest) == canvas_class)
                canvas_loadbang((t_canvas *)pd_this->pd_newest);
        }
        canvas_undo_add(x, UNDO_SEQUENCE_END, "paste/replace", 0);

            /* free the selection copy */
        for (y = mysel; y; )
        {
            t_selection*next = y->sel_next;
            freebytes(y, sizeof(*y));
            y = next;
        }

    }
}